

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O3

_Bool aom_compute_mean_stddev_c
                (uchar *frame,int stride,int x,int y,double *mean,double *one_over_stddev)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int j;
  long lVar6;
  double dVar7;
  double __x;
  
  iVar2 = x + (y + -7) * stride + -7;
  iVar4 = 0;
  iVar3 = 0;
  iVar5 = 0;
  do {
    lVar6 = 0;
    do {
      bVar1 = frame[iVar2 + (int)lVar6];
      iVar5 = iVar5 + (uint)bVar1;
      iVar3 = iVar3 + (uint)bVar1 * (uint)bVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    iVar4 = iVar4 + 1;
    iVar2 = iVar2 + stride;
  } while (iVar4 != 0x10);
  dVar7 = (double)iVar5 * 0.0625;
  *mean = dVar7;
  __x = (double)iVar3 - dVar7 * dVar7;
  dVar7 = 0.0;
  if (256.0 <= __x) {
    if (__x < 0.0) {
      dVar7 = sqrt(__x);
    }
    else {
      dVar7 = SQRT(__x);
    }
    dVar7 = 1.0 / dVar7;
  }
  *one_over_stddev = dVar7;
  return 256.0 <= __x;
}

Assistant:

bool aom_compute_mean_stddev_c(const unsigned char *frame, int stride, int x,
                               int y, double *mean, double *one_over_stddev) {
  int sum = 0;
  int sumsq = 0;
  for (int i = 0; i < MATCH_SZ; ++i) {
    for (int j = 0; j < MATCH_SZ; ++j) {
      sum += frame[(i + y - MATCH_SZ_BY2) * stride + (j + x - MATCH_SZ_BY2)];
      sumsq += frame[(i + y - MATCH_SZ_BY2) * stride + (j + x - MATCH_SZ_BY2)] *
               frame[(i + y - MATCH_SZ_BY2) * stride + (j + x - MATCH_SZ_BY2)];
    }
  }
  *mean = (double)sum / MATCH_SZ;
  const double variance = sumsq - (*mean) * (*mean);
  if (variance < MIN_FEATURE_VARIANCE) {
    *one_over_stddev = 0.0;
    return false;
  }
  *one_over_stddev = 1.0 / sqrt(variance);
  return true;
}